

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int i;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int r;
  long lVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  int col;
  undefined4 uVar9;
  Matrix<float,_4,_3> res;
  float local_b8 [4];
  float local_a8 [6];
  undefined8 local_90;
  float local_88;
  undefined1 auStack_84 [4];
  Type in1;
  Vector<float,_3> res_2;
  float afStack_48 [2];
  Matrix<float,_3,_4> retVal;
  Type in0;
  
  pfVar3 = retVal.m_data.m_data[0].m_data + 2;
  pfVar4 = retVal.m_data.m_data[0].m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afStack_48[0] = (evalCtx->coords).m_data[0];
    afStack_48[1] = (evalCtx->coords).m_data[1];
    retVal.m_data.m_data[0].m_data[0] = (evalCtx->coords).m_data[2];
    retVal.m_data.m_data[0].m_data[1] = (evalCtx->coords).m_data[3];
  }
  else {
    afStack_48[0] = 1.4;
    afStack_48[1] = 0.2;
    retVal.m_data.m_data[0].m_data[0] = -0.5;
    retVal.m_data.m_data[0].m_data[1] = 0.7;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_b8[2] = (evalCtx->coords).m_data[2];
  }
  else {
    local_b8[2] = 0.8;
  }
  pfVar2 = in1.m_data + 2;
  stack0xffffffffffffff88 = (Vec4 *)0x0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar8) = uVar9;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x30);
    lVar6 = lVar6 + 1;
    pfVar2 = pfVar2 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar6 != 3);
  pfVar2 = in1.m_data + 2;
  lVar5 = 0;
  do {
    fVar1 = local_b8[lVar5];
    lVar6 = 0;
    pfVar7 = pfVar2;
    do {
      *pfVar7 = afStack_48[lVar6] * fVar1;
      lVar6 = lVar6 + 1;
      pfVar7 = pfVar7 + 3;
    } while (lVar6 != 4);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar5 != 3);
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar9;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    lVar6 = lVar6 + 1;
    pfVar3 = (float *)((long)pfVar3 + 4);
    lVar5 = lVar5 + 0x10;
  } while (lVar6 != 4);
  pfVar3 = in1.m_data + 2;
  lVar5 = 0;
  do {
    lVar6 = 0;
    pfVar2 = pfVar3;
    do {
      *(float *)((long)pfVar4 + lVar6 * 4) = *pfVar2;
      lVar6 = lVar6 + 1;
      pfVar2 = pfVar2 + 3;
    } while (lVar6 != 4);
    lVar5 = lVar5 + 1;
    pfVar4 = (float *)((long)pfVar4 + 0x10);
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 3);
  auStack_84 = (undefined1  [4])retVal.m_data.m_data[0].m_data[2];
  in1.m_data[0] = retVal.m_data.m_data[1].m_data[0];
  in1.m_data[1] = retVal.m_data.m_data[1].m_data[1];
  local_90 = CONCAT44(retVal.m_data.m_data[2].m_data[2],retVal.m_data.m_data[2].m_data[1]);
  local_88 = retVal.m_data.m_data[3].m_data[0];
  stack0xffffffffffffff88 = (Vec4 *)0x0;
  lVar5 = 0;
  do {
    in1.m_data[lVar5 + 2] = in1.m_data[lVar5 + -1] + *(float *)((long)&local_90 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_a8[3] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = retVal.m_data.m_data[3].m_data[1];
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar5 = 0;
  do {
    local_b8[lVar5 + 4] = in1.m_data[lVar5 + 2] + local_b8[lVar5 + 7];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  stack0xffffffffffffff88 = &evalCtx->color;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[(int)in1.m_data[lVar5 + 2]] = local_b8[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}